

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.c
# Opt level: O0

void xmlFreeProp(xmlAttrPtr cur)

{
  int iVar1;
  xmlDeregisterNodeFunc *pp_Var2;
  xmlDictPtr local_18;
  xmlDictPtr dict;
  xmlAttrPtr cur_local;
  
  local_18 = (xmlDictPtr)0x0;
  if (cur != (xmlAttrPtr)0x0) {
    if (cur->doc != (_xmlDoc *)0x0) {
      local_18 = cur->doc->dict;
    }
    if ((xmlRegisterCallbacks != 0) &&
       (pp_Var2 = __xmlDeregisterNodeDefaultValue(), *pp_Var2 != (xmlDeregisterNodeFunc)0x0)) {
      pp_Var2 = __xmlDeregisterNodeDefaultValue();
      (**pp_Var2)((xmlNodePtr)cur);
    }
    if ((cur->doc != (_xmlDoc *)0x0) && (cur->atype == XML_ATTRIBUTE_ID)) {
      xmlRemoveID(cur->doc,cur);
    }
    if (cur->children != (_xmlNode *)0x0) {
      xmlFreeNodeList(cur->children);
    }
    if ((cur->name != (xmlChar *)0x0) &&
       ((local_18 == (xmlDictPtr)0x0 || (iVar1 = xmlDictOwns(local_18,cur->name), iVar1 == 0)))) {
      (*xmlFree)(cur->name);
    }
    (*xmlFree)(cur);
  }
  return;
}

Assistant:

void
xmlFreeProp(xmlAttrPtr cur) {
    xmlDictPtr dict = NULL;
    if (cur == NULL) return;

    if (cur->doc != NULL) dict = cur->doc->dict;

    if ((xmlRegisterCallbacks) && (xmlDeregisterNodeDefaultValue))
	xmlDeregisterNodeDefaultValue((xmlNodePtr)cur);

    /* Check for ID removal -> leading to invalid references ! */
    if ((cur->doc != NULL) && (cur->atype == XML_ATTRIBUTE_ID)) {
	    xmlRemoveID(cur->doc, cur);
    }
    if (cur->children != NULL) xmlFreeNodeList(cur->children);
    DICT_FREE(cur->name)
    xmlFree(cur);
}